

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O2

void roaring_bitmap_lazy_or_inplace
               (roaring_bitmap_t *x1,roaring_bitmap_t *x2,_Bool bitsetconversion)

{
  uint8_t uVar1;
  _Bool _Var2;
  container_t *pcVar3;
  bitset_container_t *c1;
  uint16_t *puVar4;
  container_t *c;
  bitset_container_t *c_00;
  uint uVar5;
  int iVar6;
  undefined7 in_register_00000011;
  ushort key;
  roaring_array_t *prVar7;
  uint uVar8;
  container_t *old_c1;
  int iVar9;
  int iVar10;
  int iVar11;
  byte typecode;
  uint uVar12;
  uint8_t type1;
  uint8_t type2;
  uint8_t result_type;
  roaring_array_t *local_70;
  roaring_array_t *local_68;
  int local_60;
  uint local_5c;
  ulong local_58;
  ulong local_50;
  undefined4 local_48;
  int local_44;
  ulong local_40;
  ulong local_38;
  
  result_type = '\0';
  local_60 = (x2->high_low_container).size;
  if (local_60 == 0) {
    return;
  }
  uVar12 = (x1->high_low_container).size;
  local_70 = &x2->high_low_container;
  if (uVar12 == 0) {
    roaring_bitmap_overwrite(x1,x2);
    return;
  }
  local_48 = (undefined4)CONCAT71(in_register_00000011,bitsetconversion);
  puVar4 = (x1->high_low_container).keys;
  key = *(x2->high_low_container).keys;
  local_40 = (ulong)(1 - local_60);
  local_38 = 0;
  local_58 = 0;
  local_68 = &x1->high_low_container;
  do {
    local_50 = (ulong)uVar12;
    local_5c = CONCAT22(local_5c._2_2_,*puVar4);
    local_44 = (int)local_40 + (int)local_38;
    iVar10 = 0;
    while( true ) {
      prVar7 = local_70;
      iVar11 = (int)local_38;
      uVar8 = iVar11 + iVar10;
      uVar12 = (int)local_58 + iVar10;
      if ((ushort)local_5c == key) break;
      if ((ushort)local_5c < key) {
        uVar5 = (int)local_58 + iVar10 + 1;
        iVar9 = (int)local_50;
        if (iVar9 + iVar10 == uVar5) {
          iVar11 = iVar11 + iVar10;
          prVar7 = local_68;
          goto LAB_00110b0c;
        }
        puVar4 = (uint16_t *)((ulong)((uVar5 & 0xffff) * 2) + (long)local_68->keys);
        goto LAB_00110ad7;
      }
      type2 = local_70->typecodes[uVar8 & 0xffff];
      pcVar3 = get_copy_of_container
                         (local_70->containers[uVar8 & 0xffff],&type2,(_Bool)(local_70->flags & 1));
      uVar1 = type2;
      if ((prVar7->flags & 1) != 0) {
        ra_set_container_at_index(local_70,uVar8,pcVar3,type2);
      }
      prVar7 = local_68;
      ra_insert_new_key_value_at(local_68,uVar12,key,pcVar3,uVar1);
      if (local_44 + iVar10 == 0) {
        iVar6 = (int)local_58;
        uVar12 = (int)local_50 + iVar10 + 1;
        iVar11 = local_60;
        goto LAB_00110b08;
      }
      key = local_70->keys[(int)local_38 + iVar10 + 1U & 0xffff];
      iVar10 = iVar10 + 1;
    }
    typecode = local_68->typecodes[uVar12 & 0xffff];
    pcVar3 = local_68->containers[uVar12 & 0xffff];
    local_5c = (uint)typecode;
    type1 = typecode;
    _Var2 = container_is_full(pcVar3,typecode);
    if (!_Var2) {
      if ((char)local_48 == '\0') {
LAB_001109ab:
        c1 = (bitset_container_t *)get_writable_copy_if_shared(pcVar3,&type1);
      }
      else {
        if (typecode == 4) {
          typecode = *(byte *)((long)pcVar3 + 8);
        }
        if (typecode == 1) goto LAB_001109ab;
        c = container_mutable_unwrap_shared(pcVar3,&type1);
        c1 = container_to_bitset(c,type1);
        container_free(pcVar3,(uint8_t)local_5c);
        type1 = '\x01';
      }
      uVar1 = type1;
      uVar8 = iVar11 + iVar10 & 0xffff;
      type2 = local_70->typecodes[uVar8];
      c_00 = (bitset_container_t *)
             container_lazy_ior(c1,type1,local_70->containers[uVar8],type2,&result_type);
      if (c_00 != c1) {
        container_free(c1,uVar1);
      }
      ra_set_container_at_index(local_68,uVar12,c_00,result_type);
    }
    iVar9 = (int)local_50;
    uVar12 = iVar9 + iVar10;
    iVar6 = (int)local_58;
    uVar5 = iVar6 + iVar10 + 1;
    if ((uVar12 == uVar5) || (iVar11 + iVar10 + (int)local_40 == 0)) {
      iVar11 = iVar11 + iVar10 + 1;
      prVar7 = local_68;
LAB_00110b08:
      if (iVar6 + iVar10 + 1U != uVar12) {
        return;
      }
LAB_00110b0c:
      ra_append_copy_range(prVar7,local_70,iVar11,local_60,(_Bool)(local_70->flags & 1));
      return;
    }
    uVar8 = iVar11 + iVar10 + 1;
    puVar4 = (uint16_t *)((ulong)((uVar5 & 0xffff) * 2) + (long)local_68->keys);
    key = local_70->keys[uVar8 & 0xffff];
LAB_00110ad7:
    local_58 = (ulong)uVar5;
    uVar12 = iVar9 + iVar10;
    local_38 = (ulong)uVar8;
  } while( true );
}

Assistant:

void roaring_bitmap_lazy_or_inplace(roaring_bitmap_t *x1,
                                    const roaring_bitmap_t *x2,
                                    const bool bitsetconversion) {
    uint8_t result_type = 0;
    int length1 = x1->high_low_container.size;
    const int length2 = x2->high_low_container.size;

    if (0 == length2) return;

    if (0 == length1) {
        roaring_bitmap_overwrite(x1, x2);
        return;
    }
    int pos1 = 0, pos2 = 0;
    uint8_t type1, type2;
    uint16_t s1 = ra_get_key_at_index(&x1->high_low_container, pos1);
    uint16_t s2 = ra_get_key_at_index(&x2->high_low_container, pos2);
    while (true) {
        if (s1 == s2) {
            container_t *c1 = ra_get_container_at_index(
                                    &x1->high_low_container, pos1, &type1);
            if (!container_is_full(c1, type1)) {
                if ((bitsetconversion == false) ||
                    (get_container_type(c1, type1) == BITSET_CONTAINER_TYPE)
                ){
                    c1 = get_writable_copy_if_shared(c1, &type1);
                } else {
                    // convert to bitset
                    container_t *old_c1 = c1;
                    uint8_t old_type1 = type1;
                    c1 = container_mutable_unwrap_shared(c1, &type1);
                    c1 = container_to_bitset(c1, type1);
                    container_free(old_c1, old_type1);
                    type1 = BITSET_CONTAINER_TYPE;
                }

                container_t *c2 = ra_get_container_at_index(
                                        &x2->high_low_container, pos2, &type2);
                container_t *c = container_lazy_ior(c1, type1, c2, type2,
                                                    &result_type);

                if (c != c1) {  // in this instance a new container was created,
                                // and we need to free the old one
                    container_free(c1, type1);
                }

                ra_set_container_at_index(&x1->high_low_container, pos1, c,
                                          result_type);
            }
            ++pos1;
            ++pos2;
            if (pos1 == length1) break;
            if (pos2 == length2) break;
            s1 = ra_get_key_at_index(&x1->high_low_container, pos1);
            s2 = ra_get_key_at_index(&x2->high_low_container, pos2);

        } else if (s1 < s2) {  // s1 < s2
            pos1++;
            if (pos1 == length1) break;
            s1 = ra_get_key_at_index(&x1->high_low_container, pos1);

        } else {  // s1 > s2
            container_t *c2 = ra_get_container_at_index(
                                    &x2->high_low_container, pos2, &type2);
            // container_t *c2_clone = container_clone(c2, type2);
            c2 = get_copy_of_container(c2, &type2, is_cow(x2));
            if (is_cow(x2)) {
                ra_set_container_at_index(&x2->high_low_container, pos2, c2,
                                          type2);
            }
            ra_insert_new_key_value_at(&x1->high_low_container, pos1, s2, c2,
                                       type2);
            pos1++;
            length1++;
            pos2++;
            if (pos2 == length2) break;
            s2 = ra_get_key_at_index(&x2->high_low_container, pos2);
        }
    }
    if (pos1 == length1) {
        ra_append_copy_range(&x1->high_low_container, &x2->high_low_container,
                             pos2, length2, is_cow(x2));
    }
}